

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

int lws_state_transition_steps(lws_state_manager_t *mgr,int target)

{
  int state;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char temp8 [8];
  
  state = mgr->state;
  iVar1 = 0;
  while ((iVar1 == 0 && (mgr->state != target))) {
    iVar1 = _lws_state_transition(mgr,mgr->state + 1);
  }
  pcVar2 = _systnm(mgr,state,temp8);
  pcVar3 = _systnm(mgr,mgr->state,temp8);
  _lws_log(8,"%s: %s -> %s\n","lws_state_transition_steps",pcVar2,pcVar3);
  return 0;
}

Assistant:

int
lws_state_transition_steps(lws_state_manager_t *mgr, int target)
{
	int n = 0;
#if defined(_DEBUG)
	int i = mgr->state;
	char temp8[8];
#endif

	while (!n && mgr->state != target)
		n = _lws_state_transition(mgr, mgr->state + 1);

#if defined(_DEBUG)
	lwsl_info("%s: %s -> %s\n", __func__, _systnm(mgr, i, temp8),
			_systnm(mgr, mgr->state, temp8));
#endif

	return 0;
}